

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaBlockMetadata_TLSF::PrintDetailedMap(VmaBlockMetadata_TLSF *this,VmaJsonWriter *json)

{
  Block *pBVar1;
  VkDeviceSize size;
  VmaBlockMetadata_TLSF *this_00;
  ulong uVar2;
  ulong uVar3;
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
  blockList;
  VmaDetailedStatistics stats;
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
  local_88;
  ulong local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_88.m_Allocator.m_pCallbacks = (this->super_VmaBlockMetadata).m_pAllocationCallbacks;
  uVar3 = this->m_BlocksFreeCount + this->m_AllocCount;
  if (uVar3 == 0) {
    local_88.m_pArray = (Block **)0x0;
  }
  else {
    local_88.m_pArray = (Block **)VmaMalloc(local_88.m_Allocator.m_pCallbacks,uVar3 * 8,8);
  }
  uVar2 = uVar3;
  for (pBVar1 = this->m_NullBlock->prevPhysical; pBVar1 != (Block *)0x0;
      pBVar1 = pBVar1->prevPhysical) {
    local_88.m_pArray[uVar2 - 1] = pBVar1;
    uVar2 = uVar2 - 1;
  }
  uStack_58 = 0;
  uStack_54 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  local_38 = 0xffffffffffffffff;
  local_30 = 0;
  local_88.m_Count = uVar3;
  local_88.m_Capacity = uVar3;
  (*(this->super_VmaBlockMetadata)._vptr_VmaBlockMetadata[0xe])(this);
  this_00 = this;
  VmaBlockMetadata::PrintDetailedMap_Begin
            (&this->super_VmaBlockMetadata,json,
             CONCAT44(uStack_5c,uStack_60) - CONCAT44(uStack_54,uStack_58),local_68 >> 0x20,
             (ulong)uStack_50);
  for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
    pBVar1 = local_88.m_pArray[uVar2];
    if (pBVar1->prevFree == pBVar1) {
      this_00 = this;
      VmaBlockMetadata::PrintDetailedMap_Allocation
                (&this->super_VmaBlockMetadata,json,pBVar1->offset,pBVar1->size,
                 (pBVar1->field_5).userData);
    }
    else {
      VmaBlockMetadata::PrintDetailedMap_UnusedRange
                (&this_00->super_VmaBlockMetadata,json,pBVar1->offset,pBVar1->size);
    }
  }
  size = this->m_NullBlock->size;
  if (size != 0) {
    VmaBlockMetadata::PrintDetailedMap_UnusedRange
              (&this_00->super_VmaBlockMetadata,json,this->m_NullBlock->offset,size);
  }
  VmaJsonWriter::EndArray(json);
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>::
  ~VmaVector(&local_88);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::PrintDetailedMap(class VmaJsonWriter& json) const
{
    size_t blockCount = m_AllocCount + m_BlocksFreeCount;
    VmaStlAllocator<Block*> allocator(GetAllocationCallbacks());
    VmaVector<Block*, VmaStlAllocator<Block*>> blockList(blockCount, allocator);

    size_t i = blockCount;
    for (Block* block = m_NullBlock->prevPhysical; block != VMA_NULL; block = block->prevPhysical)
    {
        blockList[--i] = block;
    }
    VMA_ASSERT(i == 0);

    VmaDetailedStatistics stats;
    VmaClearDetailedStatistics(stats);
    AddDetailedStatistics(stats);

    PrintDetailedMap_Begin(json,
        stats.statistics.blockBytes - stats.statistics.allocationBytes,
        stats.statistics.allocationCount,
        stats.unusedRangeCount);

    for (; i < blockCount; ++i)
    {
        Block* block = blockList[i];
        if (block->IsFree())
            PrintDetailedMap_UnusedRange(json, block->offset, block->size);
        else
            PrintDetailedMap_Allocation(json, block->offset, block->size, block->UserData());
    }
    if (m_NullBlock->size > 0)
        PrintDetailedMap_UnusedRange(json, m_NullBlock->offset, m_NullBlock->size);

    PrintDetailedMap_End(json);
}